

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDComponentPtrPair __thiscall ON_SubDFace::VertexEdgePair(ON_SubDFace *this,uint vertex_index)

{
  ushort uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ON_SubDEdgePtr *pOVar6;
  ON_SubDEdgePtr *pOVar7;
  ON_SubDComponentPtrPair OVar8;
  ON_SubDComponentPtrPair OVar9;
  
  uVar1 = this->m_edge_count;
  if ((vertex_index < uVar1 && 2 < uVar1) &&
     (pOVar7 = this->m_edgex, uVar1 < 5 || pOVar7 != (ON_SubDEdgePtr *)0x0)) {
    uVar5 = ((vertex_index + uVar1) - 1) % (uint)uVar1;
    pOVar6 = pOVar7 + -4;
    if (uVar5 < 4) {
      pOVar6 = this->m_edge4;
    }
    uVar2 = *(ulong *)((long)&pOVar6->m_ptr + (ulong)(uVar5 * 8));
    pOVar7 = pOVar7 + ((ulong)vertex_index - 4);
    if (vertex_index < 4) {
      pOVar7 = this->m_edge4 + vertex_index;
    }
    if (((uVar2 & 0xfffffffffffffff8) != 0) &&
       (lVar3 = *(long *)((uVar2 & 0xfffffffffffffff8) + 0x80 + (ulong)(~(uint)uVar2 & 1) * 8),
       lVar3 != 0)) {
      uVar4 = pOVar7->m_ptr;
      if (((uVar4 & 0xfffffffffffffff8) != 0) &&
         (lVar3 == *(long *)((uVar4 & 0xfffffffffffffff8) + 0x80 + (ulong)((uint)uVar4 & 1) * 8))) {
        OVar9.m_pair[0].m_ptr = uVar2 & 0xfffffffffffffff9 | 4;
        OVar9.m_pair[1].m_ptr = uVar4 & 0xfffffffffffffff9 | 4;
        return (ON_SubDComponentPtrPair)OVar9.m_pair;
      }
    }
  }
  OVar8.m_pair[1].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
  OVar8.m_pair[0].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
  return (ON_SubDComponentPtrPair)OVar8.m_pair;
}

Assistant:

const ON_SubDComponentPtrPair ON_SubDFace::VertexEdgePair(
  unsigned vertex_index
) const
{
  for (;;)
  {
    const unsigned edge_count = m_edge_count;
    if (edge_count < 3)
      break;
    if (vertex_index >= edge_count)
      break;
    if (edge_count > 4 && nullptr == m_edgex)
      break;
    const unsigned fei0 = (vertex_index + (edge_count - 1)) % edge_count;
    const ON_SubDEdgePtr eptr[2] =
    {
      (fei0 < 4 ? m_edge4[fei0] : m_edgex[fei0 - 4]),
      (vertex_index < 4 ? m_edge4[vertex_index] : m_edgex[vertex_index - 4]),
    };
    const ON_SubDVertex* v = eptr[0].RelativeVertex(1);
    if (nullptr == v || v != eptr[1].RelativeVertex(0))
      break;
    return ON_SubDComponentPtrPair::Create( ON_SubDComponentPtr::Create(eptr[0]), ON_SubDComponentPtr::Create(eptr[1]) );
  }
  return ON_SubDComponentPtrPair::Null;
}